

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

value_type * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
CreateValueTypeInternal
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,MapKey *key)

{
  Arena *pAVar1;
  value_type *this_00;
  
  pAVar1 = this->arena_;
  if (pAVar1 == (Arena *)0x0) {
    this_00 = (value_type *)operator_new(0x20);
    (&(this_00->first).val_)[1].int32_value_ = 0;
    MapKey::CopyFrom((MapKey *)this_00,key);
    (this_00->second).data_ = (void *)0x0;
    (this_00->second).type_ = 0;
  }
  else {
    if (pAVar1->hooks_cookie_ != (void *)0x0) {
      Arena::OnArenaAllocation(pAVar1,(type_info *)&unsigned_char::typeinfo,0x20);
    }
    this_00 = (value_type *)internal::ArenaImpl::AllocateAligned(&pAVar1->impl_,0x20);
    pAVar1 = this->arena_;
    (&(this_00->first).val_)[1].int32_value_ = 0;
    Arena::OwnDestructor<google::protobuf::MapKey>(pAVar1,(MapKey *)this_00);
    (this_00->second).data_ = (void *)0x0;
    (this_00->second).type_ = 0;
    MapKey::CopyFrom((MapKey *)this_00,key);
  }
  return this_00;
}

Assistant:

value_type* CreateValueTypeInternal(const Key& key) {
    if (arena_ == NULL) {
      return new value_type(key);
    } else {
      value_type* value = reinterpret_cast<value_type*>(
          Arena::CreateArray<uint8>(arena_, sizeof(value_type)));
      Arena::CreateInArenaStorage(const_cast<Key*>(&value->first), arena_);
      Arena::CreateInArenaStorage(&value->second, arena_);
      const_cast<Key&>(value->first) = key;
      return value;
    }
  }